

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O1

void writefv(FILE *f,char *fmt,__va_list_tag *v)

{
  uint uVar1;
  byte bVar2;
  int *piVar3;
  int iVar4;
  byte *pbVar5;
  
  bVar2 = *fmt;
  if (bVar2 != 0) {
    pbVar5 = (byte *)(fmt + 1);
    do {
      if (bVar2 < 0x32) {
        if (bVar2 != 0x20) {
          if (bVar2 != 0x31) {
            return;
          }
          uVar1 = v->gp_offset;
          if ((ulong)uVar1 < 0x29) {
            piVar3 = (int *)((ulong)uVar1 + (long)v->reg_save_area);
            v->gp_offset = uVar1 + 8;
          }
          else {
            piVar3 = (int *)v->overflow_arg_area;
            v->overflow_arg_area = piVar3 + 2;
          }
          iVar4 = *piVar3 << 0x18;
          goto LAB_0010d02b;
        }
      }
      else {
        if (bVar2 == 0x32) {
          uVar1 = v->gp_offset;
          if ((ulong)uVar1 < 0x29) {
            piVar3 = (int *)((ulong)uVar1 + (long)v->reg_save_area);
            v->gp_offset = uVar1 + 8;
          }
          else {
            piVar3 = (int *)v->overflow_arg_area;
            v->overflow_arg_area = piVar3 + 2;
          }
          iVar4 = *piVar3;
          fputc((int)(char)iVar4,(FILE *)f);
          iVar4 = iVar4 << 0x10;
        }
        else {
          if (bVar2 != 0x34) {
            return;
          }
          uVar1 = v->gp_offset;
          if ((ulong)uVar1 < 0x29) {
            piVar3 = (int *)((ulong)uVar1 + (long)v->reg_save_area);
            v->gp_offset = uVar1 + 8;
          }
          else {
            piVar3 = (int *)v->overflow_arg_area;
            v->overflow_arg_area = piVar3 + 2;
          }
          iVar4 = *piVar3;
          fputc((int)(char)iVar4,(FILE *)f);
          fputc((int)(char)((uint)iVar4 >> 8),(FILE *)f);
          fputc((int)(char)((uint)iVar4 >> 0x10),(FILE *)f);
        }
LAB_0010d02b:
        fputc(iVar4 >> 0x18,(FILE *)f);
      }
      bVar2 = *pbVar5;
      pbVar5 = pbVar5 + 1;
    } while (bVar2 != 0);
  }
  return;
}

Assistant:

static void writefv(FILE *f, char *fmt, va_list v)
{
   while (*fmt) {
      switch (*fmt++) {
         case ' ': break;
         case '1': { uint8 x = va_arg(v, int); write8(f,x); break; }
         case '2': { int16 x = va_arg(v, int); write8(f,x); write8(f,x>>8); break; }
         case '4': { int32 x = va_arg(v, int); write8(f,x); write8(f,x>>8); write8(f,x>>16); write8(f,x>>24); break; }
         default:
            assert(0);
            va_end(v);
            return;
      }
   }
}